

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O1

void __thiscall
TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>_>::ForcePrepareIntPtIndices
          (TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>_> *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  TPZMaterial *pTVar4;
  long *plVar5;
  TPZIntPoints *pTVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  long lVar11;
  
  pTVar4 = TPZCompEl::Material((TPZCompEl *)this);
  if (pTVar4 == (TPZMaterial *)0x0) {
    plVar5 = (long *)0x0;
  }
  else {
    plVar5 = (long *)__dynamic_cast(pTVar4,&TPZMaterial::typeinfo,&TPZMatWithMemBase::typeinfo,
                                    0xfffffffffffffffe);
  }
  if (pTVar4 == (TPZMaterial *)0x0 || plVar5 == (long *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error at ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual void TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>>::ForcePrepareIntPtIndices() [TBASE = TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>]"
               ,0xa0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," this->Material() == NULL\n",0x1a);
    return;
  }
  iVar2 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>).
                                 super_TPZMultiphysicsElement.super_TPZCompEl + 0x180))(this);
  if (iVar2 != 0) {
    pTVar6 = TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>::GetIntegrationRule
                       (&this->super_TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>);
    uVar3 = (*pTVar6->_vptr_TPZIntPoints[3])(pTVar6);
    TPZManVector<long,_128>::Resize
              (&(this->fIntPtIndices).super_TPZManVector<long,_128>,(long)(int)uVar3);
    if (((int)uVar3 < 1) || (gSinglePointMemory == false)) {
      if (0 < (int)uVar3) {
        uVar8 = 0;
        do {
          iVar2 = (**(code **)(*plVar5 + 0x58))(plVar5,0xffffffff);
          (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore[uVar8] =
               (long)iVar2;
          uVar8 = uVar8 + 1;
        } while (uVar3 != uVar8);
      }
    }
    else {
      iVar2 = (**(code **)(*plVar5 + 0x58))(plVar5,0xffffffff);
      auVar1 = _DAT_014f8350;
      plVar5 = (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore;
      lVar7 = (ulong)uVar3 - 1;
      auVar9._8_4_ = (int)lVar7;
      auVar9._0_8_ = lVar7;
      auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar9 = auVar9 ^ _DAT_014f8350;
      auVar10 = _DAT_014f8340;
      do {
        auVar12 = auVar10 ^ auVar1;
        if ((bool)(~(auVar12._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar12._0_4_ ||
                    auVar9._4_4_ < auVar12._4_4_) & 1)) {
          *(long *)((long)plVar5 + lVar7) = (long)iVar2;
        }
        if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
            auVar12._12_4_ <= auVar9._12_4_) {
          *(long *)((long)plVar5 + lVar7 + 8) = (long)iVar2;
        }
        lVar11 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar11 + 2;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(uVar3 + 1 >> 1) << 4 != lVar7);
    }
  }
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::ForcePrepareIntPtIndices() {
    
    TPZMaterial * material = TBASE::Material();
    auto * matWithMem =
        dynamic_cast<TPZMatWithMemBase *>(material);
    if(!material || !matWithMem){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        return;
    }
    
    if (this->NumberOfCompElementsInsideThisCompEl() == 0) {
        // This is suposed to happen if in the constructor of a multiphysics element. The CompEl vector is only initialized after the autobuild
        return;
    }
    
    const TPZIntPoints &intrule = TBASE::GetIntegrationRule();
    
    int intrulepoints = intrule.NPoints();
    
    fIntPtIndices.Resize(intrulepoints);
    
    if(gSinglePointMemory && intrulepoints > 0)
    {
        int64_t point_index = matWithMem->PushMemItem();
#ifdef PZDEBUG
        if(point_index < 0)
        {
            std::cout << __PRETTY_FUNCTION__ << " material has no memory interface\n";
        }
#endif
        for(int int_ind = 0; int_ind < intrulepoints; ++int_ind){
            fIntPtIndices[int_ind] = point_index;
            // Pushing a new entry in the material memory
        } //Loop over integratin points generating a reference vector of memory
    }
    else
    {
        for(int int_ind = 0; int_ind < intrulepoints; ++int_ind){
            fIntPtIndices[int_ind] = matWithMem->PushMemItem();
            // Pushing a new entry in the material memory
        } //Loop over integratin points generating a reference vector of memory
          //entries in the related pzmatwithmem for further use.
    }
    
}